

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  Expr *p;
  Vdbe *p_00;
  ExprList *pEVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int p1;
  int *aiMap;
  CollSeq *pCVar8;
  Expr *pEVar9;
  byte bVar10;
  int *piVar11;
  long lVar12;
  int *piVar13;
  int *piVar14;
  ExprList_item *pEVar15;
  uint local_88;
  uint local_64;
  int local_4c;
  int rRhsHasNull;
  byte *local_40;
  int regToFree;
  int iDummy;
  
  rRhsHasNull = 0;
  p = pExpr->pLeft;
  iVar2 = sqlite3ExprCheckIN(pParse,pExpr);
  if (iVar2 != 0) {
    return;
  }
  local_40 = (byte *)exprINAffinity(pParse,pExpr);
  uVar3 = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int *)sqlite3DbMallocZero(pParse->db,(long)(int)uVar3 * 5 + 1);
  if (pParse->db->mallocFailed != '\0') goto LAB_0014fd9c;
  p_00 = pParse->pVdbe;
  piVar13 = (int *)0x0;
  piVar11 = &rRhsHasNull;
  if (destIfFalse == destIfNull) {
    piVar11 = piVar13;
  }
  iVar2 = sqlite3FindInIndex(pParse,pExpr,3,piVar11,aiMap);
  iVar4 = exprCodeVector(pParse,p,&iDummy);
  piVar11 = (int *)0x0;
  if (0 < (int)uVar3) {
    piVar11 = (int *)(ulong)uVar3;
  }
  for (; (piVar14 = piVar11, piVar11 != piVar13 &&
         (piVar14 = piVar13, piVar13 == (int *)(ulong)(uint)aiMap[(long)piVar13]));
      piVar13 = (int *)((long)piVar13 + 1)) {
  }
  p1 = iVar4;
  if ((uint)piVar14 != uVar3) {
    p1 = sqlite3GetTempRange(pParse,uVar3);
    for (piVar13 = (int *)0x0; piVar11 != piVar13; piVar13 = (int *)((long)piVar13 + 1)) {
      sqlite3VdbeAddOp3(p_00,0x4e,iVar4 + (int)piVar13,aiMap[(long)piVar13] + p1,0);
    }
  }
  if (iVar2 == 5) {
    pEVar1 = (pExpr->x).pList;
    pCVar8 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
    uVar3 = sqlite3VdbeMakeLabel(p_00);
    iVar2 = 0;
    if (destIfFalse != destIfNull) {
      iVar2 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(p_00,0x5c,p1,p1,iVar2);
    }
    pEVar15 = pEVar1->a;
    for (lVar12 = 0; lVar12 < pEVar1->nExpr; lVar12 = lVar12 + 1) {
      iVar5 = sqlite3ExprCodeTemp(pParse,pEVar15->pExpr,&regToFree);
      if ((iVar2 != 0) && (iVar6 = sqlite3ExprCanBeNull(pEVar15->pExpr), iVar6 != 0)) {
        sqlite3VdbeAddOp3(p_00,0x5c,iVar2,iVar5,iVar2);
      }
      if ((destIfFalse == destIfNull) && ((long)pEVar1->nExpr + -1 <= lVar12)) {
        sqlite3VdbeAddOp4(p_00,0x34,p1,destIfFalse,iVar5,(char *)pCVar8,-2);
        uVar7 = p_00->nOp;
        if (0 < (int)uVar7) {
          bVar10 = *local_40 | 0x10;
LAB_0014f9d4:
          p_00->aOp[(ulong)uVar7 - 1].p5 = (short)(char)bVar10;
        }
      }
      else {
        sqlite3VdbeAddOp4(p_00,0x35,p1,uVar3,iVar5,(char *)pCVar8,-2);
        uVar7 = p_00->nOp;
        if (0 < (int)uVar7) {
          bVar10 = *local_40;
          goto LAB_0014f9d4;
        }
      }
      if (regToFree != 0) {
        bVar10 = pParse->nTempReg;
        if ((ulong)bVar10 < 8) {
          pParse->nTempReg = bVar10 + 1;
          pParse->aTempReg[bVar10] = regToFree;
        }
      }
      pEVar15 = pEVar15 + 1;
    }
    if (iVar2 != 0) {
      sqlite3VdbeAddOp2(p_00,0x32,iVar2,destIfNull);
      sqlite3VdbeGoto(p_00,destIfFalse);
    }
    piVar11 = p_00->pParse->aLabel;
    if (piVar11 != (int *)0x0) {
      piVar11[(int)~uVar3] = p_00->nOp;
    }
    if (iVar2 != 0) {
      bVar10 = pParse->nTempReg;
      if ((ulong)bVar10 < 8) {
        pParse->nTempReg = bVar10 + 1;
        pParse->aTempReg[bVar10] = iVar2;
      }
    }
  }
  else {
    iVar5 = 0;
    local_64 = 0;
    uVar7 = destIfFalse;
    if (destIfFalse != destIfNull) {
      local_64 = sqlite3VdbeMakeLabel(p_00);
      uVar7 = local_64;
    }
    for (; (int)piVar11 != iVar5; iVar5 = iVar5 + 1) {
      pEVar9 = sqlite3VectorFieldSubexpr(pExpr->pLeft,iVar5);
      iVar6 = sqlite3ExprCanBeNull(pEVar9);
      if (iVar6 != 0) {
        sqlite3VdbeAddOp2(p_00,0x32,p1 + iVar5,uVar7);
      }
    }
    if (iVar2 == 1) {
      sqlite3VdbeAddOp3(p_00,0x1e,pExpr->iTable,destIfFalse,p1);
      local_4c = sqlite3VdbeAddOp0(p_00,0xb);
    }
    else {
      sqlite3VdbeAddOp4(p_00,0x5b,p1,uVar3,0,(char *)local_40,uVar3);
      if (destIfFalse == destIfNull) {
        sqlite3VdbeAddOp4Int(p_00,0x1c,pExpr->iTable,destIfFalse,p1,uVar3);
        goto LAB_0014fd72;
      }
      local_4c = sqlite3VdbeAddOp4Int(p_00,0x1d,pExpr->iTable,0,p1,uVar3);
    }
    if (uVar3 == 1 && rRhsHasNull != 0) {
      sqlite3VdbeAddOp2(p_00,0x33,rRhsHasNull,destIfFalse);
    }
    if (destIfFalse == destIfNull) {
      sqlite3VdbeGoto(p_00,destIfFalse);
    }
    if ((local_64 != 0) && (piVar13 = p_00->pParse->aLabel, piVar13 != (int *)0x0)) {
      piVar13[(int)~local_64] = p_00->nOp;
    }
    iVar2 = sqlite3VdbeAddOp2(p_00,0x24,pExpr->iTable,destIfFalse);
    local_88 = destIfFalse;
    if (1 < (int)uVar3) {
      local_88 = sqlite3VdbeMakeLabel(p_00);
    }
    for (iVar5 = 0; (int)piVar11 != iVar5; iVar5 = iVar5 + 1) {
      iVar6 = sqlite3GetTempReg(pParse);
      pEVar9 = sqlite3VectorFieldSubexpr(p,iVar5);
      pCVar8 = sqlite3ExprCollSeq(pParse,pEVar9);
      sqlite3VdbeAddOp3(p_00,0x5a,pExpr->iTable,iVar5,iVar6);
      sqlite3VdbeAddOp4(p_00,0x34,p1 + iVar5,local_88,iVar6,(char *)pCVar8,-2);
      if (iVar6 != 0) {
        bVar10 = pParse->nTempReg;
        if ((ulong)bVar10 < 8) {
          pParse->nTempReg = bVar10 + 1;
          pParse->aTempReg[bVar10] = iVar6;
        }
      }
    }
    sqlite3VdbeAddOp2(p_00,0xb,0,destIfNull);
    if (1 < (int)uVar3) {
      piVar11 = p_00->pParse->aLabel;
      if (piVar11 != (int *)0x0) {
        piVar11[(int)~local_88] = p_00->nOp;
      }
      sqlite3VdbeAddOp2(p_00,5,pExpr->iTable,iVar2 + 1);
      sqlite3VdbeAddOp2(p_00,0xb,0,destIfFalse);
    }
    sqlite3VdbeJumpHere(p_00,local_4c);
  }
LAB_0014fd72:
  if (p1 != 0 && p1 != iVar4) {
    bVar10 = pParse->nTempReg;
    if ((ulong)bVar10 < 8) {
      pParse->nTempReg = bVar10 + 1;
      pParse->aTempReg[bVar10] = p1;
    }
  }
LAB_0014fd9c:
  sqlite3DbFree(pParse->db,aiMap);
  sqlite3DbFree(pParse->db,local_40);
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  int eType;            /* Type of the RHS */
  int rLhs;             /* Register(s) holding the LHS values */
  int rLhsOrig;         /* LHS values prior to reordering by aiMap[] */
  Vdbe *v;              /* Statement under construction */
  int *aiMap = 0;       /* Map from vector field to index column */
  char *zAff = 0;       /* Affinity string for comparisons */
  int nVector;          /* Size of vectors for this IN operator */
  int iDummy;           /* Dummy parameter to exprCodeVector() */
  Expr *pLeft;          /* The LHS of the IN operator */
  int i;                /* loop counter */
  int destStep2;        /* Where to jump when NULLs seen in step 2 */
  int destStep6 = 0;    /* Start of code for Step 6 */
  int addrTruthOp;      /* Address of opcode that determines the IN is true */
  int destNotNull;      /* Jump here if a comparison is not true in step 6 */
  int addrTop;          /* Top of the step-6 loop */ 

  pLeft = pExpr->pLeft;
  if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
  zAff = exprINAffinity(pParse, pExpr);
  nVector = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int*)sqlite3DbMallocZero(
      pParse->db, nVector*(sizeof(int) + sizeof(char)) + 1
  );
  if( pParse->db->mallocFailed ) goto sqlite3ExprCodeIN_oom_error;

  /* Attempt to compute the RHS. After this step, if anything other than
  ** IN_INDEX_NOOP is returned, the table opened ith cursor pExpr->iTable 
  ** contains the values that make up the RHS. If IN_INDEX_NOOP is returned,
  ** the RHS has not yet been coded.  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr,
                             IN_INDEX_MEMBERSHIP | IN_INDEX_NOOP_OK,
                             destIfFalse==destIfNull ? 0 : &rRhsHasNull, aiMap);

  assert( pParse->nErr || nVector==1 || eType==IN_INDEX_EPH
       || eType==IN_INDEX_INDEX_ASC || eType==IN_INDEX_INDEX_DESC 
  );
#ifdef SQLITE_DEBUG
  /* Confirm that aiMap[] contains nVector integer values between 0 and
  ** nVector-1. */
  for(i=0; i<nVector; i++){
    int j, cnt;
    for(cnt=j=0; j<nVector; j++) if( aiMap[j]==i ) cnt++;
    assert( cnt==1 );
  }
#endif

  /* Code the LHS, the <expr> from "<expr> IN (...)". If the LHS is a 
  ** vector, then it is stored in an array of nVector registers starting 
  ** at r1.
  **
  ** sqlite3FindInIndex() might have reordered the fields of the LHS vector
  ** so that the fields are in the same order as an existing index.   The
  ** aiMap[] array contains a mapping from the original LHS field order to
  ** the field order that matches the RHS index.
  */
  rLhsOrig = exprCodeVector(pParse, pLeft, &iDummy);
  for(i=0; i<nVector && aiMap[i]==i; i++){} /* Are LHS fields reordered? */
  if( i==nVector ){
    /* LHS fields are not reordered */
    rLhs = rLhsOrig;
  }else{
    /* Need to reorder the LHS fields according to aiMap */
    rLhs = sqlite3GetTempRange(pParse, nVector);
    for(i=0; i<nVector; i++){
      sqlite3VdbeAddOp3(v, OP_Copy, rLhsOrig+i, rLhs+aiMap[i], 0);
    }
  }

  /* If sqlite3FindInIndex() did not find or create an index that is
  ** suitable for evaluating the IN operator, then evaluate using a
  ** sequence of comparisons.
  **
  ** This is step (1) in the in-operator.md optimized algorithm.
  */
  if( eType==IN_INDEX_NOOP ){
    ExprList *pList = pExpr->x.pList;
    CollSeq *pColl = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    int labelOk = sqlite3VdbeMakeLabel(v);
    int r2, regToFree;
    int regCkNull = 0;
    int ii;
    assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
    if( destIfNull!=destIfFalse ){
      regCkNull = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_BitAnd, rLhs, rLhs, regCkNull);
    }
    for(ii=0; ii<pList->nExpr; ii++){
      r2 = sqlite3ExprCodeTemp(pParse, pList->a[ii].pExpr, &regToFree);
      if( regCkNull && sqlite3ExprCanBeNull(pList->a[ii].pExpr) ){
        sqlite3VdbeAddOp3(v, OP_BitAnd, regCkNull, r2, regCkNull);
      }
      if( ii<pList->nExpr-1 || destIfNull!=destIfFalse ){
        sqlite3VdbeAddOp4(v, OP_Eq, rLhs, labelOk, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, ii<pList->nExpr-1);
        VdbeCoverageIf(v, ii==pList->nExpr-1);
        sqlite3VdbeChangeP5(v, zAff[0]);
      }else{
        assert( destIfNull==destIfFalse );
        sqlite3VdbeAddOp4(v, OP_Ne, rLhs, destIfFalse, r2,
                          (void*)pColl, P4_COLLSEQ); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, zAff[0] | SQLITE_JUMPIFNULL);
      }
      sqlite3ReleaseTempReg(pParse, regToFree);
    }
    if( regCkNull ){
      sqlite3VdbeAddOp2(v, OP_IsNull, regCkNull, destIfNull); VdbeCoverage(v);
      sqlite3VdbeGoto(v, destIfFalse);
    }
    sqlite3VdbeResolveLabel(v, labelOk);
    sqlite3ReleaseTempReg(pParse, regCkNull);
    goto sqlite3ExprCodeIN_finished;
  }

  /* Step 2: Check to see if the LHS contains any NULL columns.  If the
  ** LHS does contain NULLs then the result must be either FALSE or NULL.
  ** We will then skip the binary search of the RHS.
  */
  if( destIfNull==destIfFalse ){
    destStep2 = destIfFalse;
  }else{
    destStep2 = destStep6 = sqlite3VdbeMakeLabel(v);
  }
  for(i=0; i<nVector; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pExpr->pLeft, i);
    if( sqlite3ExprCanBeNull(p) ){
      sqlite3VdbeAddOp2(v, OP_IsNull, rLhs+i, destStep2);
      VdbeCoverage(v);
    }
  }

  /* Step 3.  The LHS is now known to be non-NULL.  Do the binary search
  ** of the RHS using the LHS as a probe.  If found, the result is
  ** true.
  */
  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree and so we also
    ** know that the RHS is non-NULL.  Hence, we combine steps 3 and 4
    ** into a single opcode. */
    sqlite3VdbeAddOp3(v, OP_SeekRowid, pExpr->iTable, destIfFalse, rLhs);
    VdbeCoverage(v);
    addrTruthOp = sqlite3VdbeAddOp0(v, OP_Goto);  /* Return True */
  }else{
    sqlite3VdbeAddOp4(v, OP_Affinity, rLhs, nVector, 0, zAff, nVector);
    if( destIfFalse==destIfNull ){
      /* Combine Step 3 and Step 5 into a single opcode */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, pExpr->iTable, destIfFalse,
                           rLhs, nVector); VdbeCoverage(v);
      goto sqlite3ExprCodeIN_finished;
    }
    /* Ordinary Step 3, for the case where FALSE and NULL are distinct */
    addrTruthOp = sqlite3VdbeAddOp4Int(v, OP_Found, pExpr->iTable, 0,
                                      rLhs, nVector); VdbeCoverage(v);
  }

  /* Step 4.  If the RHS is known to be non-NULL and we did not find
  ** an match on the search above, then the result must be FALSE.
  */
  if( rRhsHasNull && nVector==1 ){
    sqlite3VdbeAddOp2(v, OP_NotNull, rRhsHasNull, destIfFalse);
    VdbeCoverage(v);
  }

  /* Step 5.  If we do not care about the difference between NULL and
  ** FALSE, then just return false. 
  */
  if( destIfFalse==destIfNull ) sqlite3VdbeGoto(v, destIfFalse);

  /* Step 6: Loop through rows of the RHS.  Compare each row to the LHS.
  ** If any comparison is NULL, then the result is NULL.  If all
  ** comparisons are FALSE then the final result is FALSE.
  **
  ** For a scalar LHS, it is sufficient to check just the first row
  ** of the RHS.
  */
  if( destStep6 ) sqlite3VdbeResolveLabel(v, destStep6);
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, pExpr->iTable, destIfFalse);
  VdbeCoverage(v);
  if( nVector>1 ){
    destNotNull = sqlite3VdbeMakeLabel(v);
  }else{
    /* For nVector==1, combine steps 6 and 7 by immediately returning
    ** FALSE if the first comparison is not NULL */
    destNotNull = destIfFalse;
  }
  for(i=0; i<nVector; i++){
    Expr *p;
    CollSeq *pColl;
    int r3 = sqlite3GetTempReg(pParse);
    p = sqlite3VectorFieldSubexpr(pLeft, i);
    pColl = sqlite3ExprCollSeq(pParse, p);
    sqlite3VdbeAddOp3(v, OP_Column, pExpr->iTable, i, r3);
    sqlite3VdbeAddOp4(v, OP_Ne, rLhs+i, destNotNull, r3,
                      (void*)pColl, P4_COLLSEQ);
    VdbeCoverage(v);
    sqlite3ReleaseTempReg(pParse, r3);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
  if( nVector>1 ){
    sqlite3VdbeResolveLabel(v, destNotNull);
    sqlite3VdbeAddOp2(v, OP_Next, pExpr->iTable, addrTop+1);
    VdbeCoverage(v);

    /* Step 7:  If we reach this point, we know that the result must
    ** be false. */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);
  }

  /* Jumps here in order to return true. */
  sqlite3VdbeJumpHere(v, addrTruthOp);

sqlite3ExprCodeIN_finished:
  if( rLhs!=rLhsOrig ) sqlite3ReleaseTempReg(pParse, rLhs);
  VdbeComment((v, "end IN expr"));
sqlite3ExprCodeIN_oom_error:
  sqlite3DbFree(pParse->db, aiMap);
  sqlite3DbFree(pParse->db, zAff);
}